

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2NULTerminated(void)

{
  ostringstream *this;
  bool bVar1;
  int iVar2;
  size_t __len;
  void *pvVar3;
  int *piVar4;
  int x;
  Arg *args [1];
  int local_1c4;
  Arg *local_1c0;
  Arg local_1b8;
  StringPiece local_1a8;
  LogMessage local_198;
  
  __len = sysconf(0x1e);
  pvVar3 = mmap((void *)0x0,__len * 2,3,0x22,-1,0);
  if (pvVar3 == (void *)0xffffffffffffffff) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2e8,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: v != reinterpret_cast<char*>(-1)",0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  LogMessage::LogMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
             ,0x2e9,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198.str_,"Memory at ",10);
  std::ostream::_M_insert<void_const*>(&local_198.str_);
  LogMessage::~LogMessage(&local_198);
  pvVar3 = (void *)((long)pvVar3 + __len);
  iVar2 = munmap(pvVar3,__len);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2ea,3);
    this = &local_198.str_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Check failed: (munmap(v + pagesize, pagesize)) == (0)",0x35);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," error ",7);
    piVar4 = __errno_location();
    std::ostream::operator<<((ostream *)this,*piVar4);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  *(undefined1 *)((long)pvVar3 + -1) = 0x31;
  local_1c4 = 0;
  RE2::RE2((RE2 *)&local_198,"(.*)");
  local_1c0 = &local_1b8;
  local_1b8.parser_ = RE2::Arg::parse_int;
  local_1a8.length_ = 1;
  local_1b8.arg_ = &local_1c4;
  local_1a8.ptr_ = (char *)((long)pvVar3 + -1);
  bVar1 = RE2::FullMatchN(&local_1a8,(RE2 *)&local_198,&local_1c0,1);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2ee,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,
               "Check failed: RE2::FullMatch(StringPiece(v + pagesize - 1, 1), \"(.*)\", &x)",0x4a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if (local_1c4 != 1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2ef,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: (x) == (1)",0x18);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  return;
}

Assistant:

TEST(RE2, NULTerminated) {
#if defined(_POSIX_MAPPED_FILES) && _POSIX_MAPPED_FILES > 0
  char *v;
  int x;
  long pagesize = sysconf(_SC_PAGE_SIZE);

#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
  v = static_cast<char*>(mmap(NULL, 2*pagesize, PROT_READ|PROT_WRITE,
                              MAP_ANONYMOUS|MAP_PRIVATE, -1, 0));
  CHECK(v != reinterpret_cast<char*>(-1));
  LOG(INFO) << "Memory at " << (void*)v;
  CHECK_EQ(munmap(v + pagesize, pagesize), 0) << " error " << errno;
  v[pagesize - 1] = '1';

  x = 0;
  CHECK(RE2::FullMatch(StringPiece(v + pagesize - 1, 1), "(.*)", &x));
  CHECK_EQ(x, 1);
#endif
}